

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_105c52d::BlendA64MaskTest8B_RandomValues_Test::TestBody
          (BlendA64MaskTest8B_RandomValues_Test *this)

{
  bool bVar1;
  uint8_t uVar2;
  int iVar3;
  BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int),_unsigned_char,_unsigned_char>
  *in_RDI;
  int i_1;
  int i;
  int bsize;
  int in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  int local_14;
  int local_10;
  int local_c;
  
  local_c = 0;
  while( true ) {
    in_stack_ffffffffffffffdc = in_stack_ffffffffffffffdc & 0xffffff;
    if (local_c < 0x16) {
      bVar1 = testing::Test::HasFatalFailure();
      in_stack_ffffffffffffffdc = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffdc) ^ 0xff000000;
    }
    if ((in_stack_ffffffffffffffdc & 0x1000000) == 0) break;
    for (local_10 = 0; local_10 < 0x14000; local_10 = local_10 + 1) {
      uVar2 = libaom_test::ACMRandom::Rand8((ACMRandom *)in_RDI);
      in_RDI->dst_ref_[local_10] = uVar2;
      uVar2 = libaom_test::ACMRandom::Rand8((ACMRandom *)in_RDI);
      in_RDI->dst_tst_[local_10] = uVar2;
      uVar2 = libaom_test::ACMRandom::Rand8((ACMRandom *)in_RDI);
      in_RDI->src0_[local_10] = uVar2;
      uVar2 = libaom_test::ACMRandom::Rand8((ACMRandom *)in_RDI);
      in_RDI->src1_[local_10] = uVar2;
    }
    for (local_14 = 0; local_14 < 0x10000; local_14 = local_14 + 1) {
      iVar3 = libaom_test::ACMRandom::operator()((ACMRandom *)in_RDI,in_stack_ffffffffffffffdc);
      in_RDI->mask_[local_14] = (uint8_t)iVar3;
    }
    BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int),_unsigned_char,_unsigned_char>
    ::RunTest(in_RDI,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
    local_c = local_c + 1;
  }
  return;
}

Assistant:

TEST_P(BlendA64MaskTest8B, RandomValues) {
  for (int bsize = 0; bsize < BLOCK_SIZES_ALL && !HasFatalFailure(); ++bsize) {
    for (int i = 0; i < kBufSize; ++i) {
      dst_ref_[i] = rng_.Rand8();
      dst_tst_[i] = rng_.Rand8();

      src0_[i] = rng_.Rand8();
      src1_[i] = rng_.Rand8();
    }

    for (int i = 0; i < kMaxMaskSize; ++i)
      mask_[i] = rng_(AOM_BLEND_A64_MAX_ALPHA + 1);

    RunTest(bsize, 1);
  }
}